

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::program_parameteri(NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  GLuint program;
  GLuint program_00;
  GLuint program_01;
  string local_48;
  
  program = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  program_00 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  program_01 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program_01);
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "GL_INVALID_VALUE is generated if program is not the name of an existing program object."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glProgramParameteri(&ctx->super_CallLogWrapper,program_01,0x8257,1);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "GL_INVALID_OPERATION is generated if program is the name of a shader object.","");
  NegativeTestContext::beginSection(ctx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glProgramParameteri(&ctx->super_CallLogWrapper,program_00,0x8257,1);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "GL_INVALID_ENUM is generated if pname is not GL_PROGRAM_BINARY_RETRIEVABLE_HINT or PROGRAM_SEPARABLE."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glProgramParameteri(&ctx->super_CallLogWrapper,program,0xffffffff,1);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "GL_INVALID_VALUE is generated if value is not GL_FALSE or GL_TRUE.","");
  NegativeTestContext::beginSection(ctx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glProgramParameteri(&ctx->super_CallLogWrapper,program,0x8257,2);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,program_00);
  return;
}

Assistant:

void program_parameteri (NegativeTestContext& ctx)
{
	GLuint program	= ctx.glCreateProgram();
	GLuint shader	= ctx.glCreateShader(GL_VERTEX_SHADER);

	const GLuint notAProgram = ctx.glCreateProgram();
	ctx.glDeleteProgram(notAProgram);

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not the name of an existing program object.");
	ctx.glProgramParameteri(notAProgram, GL_PROGRAM_BINARY_RETRIEVABLE_HINT, GL_TRUE);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is the name of a shader object.");
	ctx.glProgramParameteri(shader, GL_PROGRAM_BINARY_RETRIEVABLE_HINT, GL_TRUE);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not GL_PROGRAM_BINARY_RETRIEVABLE_HINT or PROGRAM_SEPARABLE.");
	ctx.glProgramParameteri(program, -1, GL_TRUE);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if value is not GL_FALSE or GL_TRUE.");
	ctx.glProgramParameteri(program, GL_PROGRAM_BINARY_RETRIEVABLE_HINT, 2);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteProgram(program);
	ctx.glDeleteShader(shader);
}